

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.c
# Opt level: O3

field_element_t polynomial_eval_lut(field_t field,polynomial_t poly,field_logarithm_t *val_exp)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  
  if (*val_exp != '\0') {
    uVar2 = 0;
    bVar1 = 0;
    do {
      uVar3 = (ulong)poly.coeff[uVar2];
      if (uVar3 != 0) {
        bVar1 = bVar1 ^ field.exp[(ulong)val_exp[uVar2] + (ulong)field.log[uVar3]];
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 <= poly.order);
    return bVar1;
  }
  return *poly.coeff;
}

Assistant:

field_element_t polynomial_eval_lut(field_t field, polynomial_t poly, const field_logarithm_t *val_exp) {
    // evaluate the polynomial poly at a particular element val
    // in this case, all of the logarithms of the successive powers of val have been precalculated
    // this removes the extra work we'd have to do to calculate val_exponentiated each time
    //   if this function is to be called on the same val multiple times
    if (val_exp[0] == 0) {
        return poly.coeff[0];
    }

    field_element_t res = 0;

    for (unsigned int i = 0; i <= poly.order; i++) {
        if (poly.coeff[i] != 0) {
            // multiply-accumulate by the next coeff times the next power of val
            res = field_add(field, res,
                    field_mul_log_element(field, field.log[poly.coeff[i]], val_exp[i]));
        }
    }
    return res;
}